

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

void prvTidyDefineTag(TidyDocImpl *doc,UserTagType tagType,ctmbstr name)

{
  byte bVar1;
  Dict *pDVar2;
  tmbstr ptVar3;
  uint uVar4;
  code *pcVar5;
  
  uVar4 = 0;
  bVar1 = 1;
  pcVar5 = (Parser *)0x0;
  switch(tagType) {
  case tagtype_empty:
    pcVar5 = prvTidyParseBlock;
    uVar4 = 0x140001;
    break;
  case tagtype_inline:
    pcVar5 = prvTidyParseInline;
    uVar4 = 0x140010;
    break;
  default:
    goto switchD_00145f0b_caseD_3;
  case tagtype_block:
    pcVar5 = prvTidyParseBlock;
    goto LAB_00145f39;
  case tagtype_pre:
    pcVar5 = prvTidyParsePre;
LAB_00145f39:
    uVar4 = 0x140008;
  }
  bVar1 = 0;
switchD_00145f0b_caseD_3:
  if (!(bool)(name == (ctmbstr)0x0 | bVar1)) {
    pDVar2 = tagsLookup(doc,&doc->tags,name);
    if (pDVar2 == (Dict *)0x0) {
      pDVar2 = (Dict *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x40);
      pDVar2->id = TidyTag_UNKNOWN;
      ptVar3 = prvTidytmbstrdup(doc->allocator,name);
      pDVar2->name = ptVar3;
      pDVar2->versions = 0;
      pDVar2->attrvers = (AttrVersion *)0x0;
      pDVar2->model = 0;
      pDVar2->parser = (Parser *)0x0;
      pDVar2->chkattrs = (CheckAttribs *)0x0;
      pDVar2->next = (Dict *)0x0;
      pDVar2->next = (doc->tags).declared_tag_list;
      (doc->tags).declared_tag_list = pDVar2;
    }
    if (pDVar2->id == TidyTag_UNKNOWN) {
      pDVar2->versions = 0xe000;
      pDVar2->model = pDVar2->model | uVar4;
      pDVar2->parser = pcVar5;
      pDVar2->chkattrs = (CheckAttribs *)0x0;
      pDVar2->attrvers = (AttrVersion *)0x0;
    }
  }
  return;
}

Assistant:

void TY_(DefineTag)( TidyDocImpl* doc, UserTagType tagType, ctmbstr name )
{
    Parser* parser = 0;
    uint cm = CM_UNKNOWN;
    uint vers = VERS_PROPRIETARY;

    switch (tagType)
    {
    case tagtype_empty:
        cm = CM_EMPTY|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParseBlock);
        break;

    case tagtype_inline:
        cm = CM_INLINE|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParseInline);
        break;

    case tagtype_block:
        cm = CM_BLOCK|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParseBlock);
        break;

    case tagtype_pre:
        cm = CM_BLOCK|CM_NO_INDENT|CM_NEW;
        parser = TY_(ParsePre);
        break;

    case tagtype_null:
        break;
    }
    if ( cm && parser )
        declare( doc, &doc->tags, name, vers, cm, parser, 0 );
}